

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>
anon_unknown.dwarf_128aeb::make_mouse_event(void)

{
  int iVar1;
  Widget *this;
  size_t sVar2;
  __uniq_ptr_data<cppurses::Event,_std::default_delete<cppurses::Event>,_true,_true> in_RDI;
  undefined1 local_a0 [40];
  long local_78;
  undefined2 local_70;
  undefined1 local_68 [16];
  Button button;
  Type type;
  pair<cppurses::Event::Type,_cppurses::Mouse::Button> type_button;
  Point local;
  Point global;
  Widget *receiver;
  wchar_t local_20;
  MEVENT mouse_event;
  
  memset((void *)((long)&receiver + 4),0,0x14);
  iVar1 = getmouse((long)&receiver + 4);
  if (iVar1 == 0) {
    this = cppurses::detail::find_widget_at((long)local_20,(long)(int)mouse_event._0_4_);
    if (this == (Widget *)0x0) {
      std::unique_ptr<cppurses::Event,std::default_delete<cppurses::Event>>::
      unique_ptr<std::default_delete<cppurses::Event>,void>
                ((unique_ptr<cppurses::Event,std::default_delete<cppurses::Event>> *)
                 in_RDI.
                 super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>._M_t.
                 super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
                 super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl,(nullptr_t)0x0);
    }
    else {
      sVar2 = cppurses::Widget::inner_x(this);
      type_button = (pair<cppurses::Event::Type,_cppurses::Mouse::Button>)((long)local_20 - sVar2);
      sVar2 = cppurses::Widget::inner_y(this);
      _button = extract_info((MEVENT *)((long)&receiver + 4));
      local_68._12_4_ = button;
      local_68._8_4_ = type;
      if (button == Left) {
        local_a0._8_4_ = type;
        local_a0._32_4_ = type_button.first;
        local_a0._36_4_ = type_button.second;
        local_70 = receiver._4_2_;
        local_a0._16_8_ = (long)local_20;
        local_a0._24_8_ = (long)(int)mouse_event._0_4_;
        local_78 = (long)(int)mouse_event._0_4_ - sVar2;
        std::make_unique<cppurses::Mouse::Press,cppurses::Widget&,cppurses::Mouse::State>
                  ((Widget *)local_68,(State *)this);
        std::unique_ptr<cppurses::Event,std::default_delete<cppurses::Event>>::
        unique_ptr<cppurses::Mouse::Press,std::default_delete<cppurses::Mouse::Press>,void>
                  ((unique_ptr<cppurses::Event,std::default_delete<cppurses::Event>> *)
                   in_RDI.
                   super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
                   super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl,
                   (unique_ptr<cppurses::Mouse::Press,_std::default_delete<cppurses::Mouse::Press>_>
                    *)local_68);
        std::unique_ptr<cppurses::Mouse::Press,_std::default_delete<cppurses::Mouse::Press>_>::
        ~unique_ptr((unique_ptr<cppurses::Mouse::Press,_std::default_delete<cppurses::Mouse::Press>_>
                     *)local_68);
      }
      else if (button == Middle) {
        std::make_unique<cppurses::Mouse::Release,cppurses::Widget&,cppurses::Mouse::State>
                  ((Widget *)local_a0,(State *)this);
        std::unique_ptr<cppurses::Event,std::default_delete<cppurses::Event>>::
        unique_ptr<cppurses::Mouse::Release,std::default_delete<cppurses::Mouse::Release>,void>
                  ((unique_ptr<cppurses::Event,std::default_delete<cppurses::Event>> *)
                   in_RDI.
                   super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
                   super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl,
                   (unique_ptr<cppurses::Mouse::Release,_std::default_delete<cppurses::Mouse::Release>_>
                    *)local_a0);
        std::unique_ptr<cppurses::Mouse::Release,_std::default_delete<cppurses::Mouse::Release>_>::
        ~unique_ptr((unique_ptr<cppurses::Mouse::Release,_std::default_delete<cppurses::Mouse::Release>_>
                     *)local_a0);
      }
      else {
        std::unique_ptr<cppurses::Event,std::default_delete<cppurses::Event>>::
        unique_ptr<std::default_delete<cppurses::Event>,void>
                  ((unique_ptr<cppurses::Event,std::default_delete<cppurses::Event>> *)
                   in_RDI.
                   super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
                   super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl,(nullptr_t)0x0);
      }
    }
  }
  else {
    std::unique_ptr<cppurses::Event,std::default_delete<cppurses::Event>>::
    unique_ptr<std::default_delete<cppurses::Event>,void>
              ((unique_ptr<cppurses::Event,std::default_delete<cppurses::Event>> *)
               in_RDI.super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>.
               _M_t.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>
               .super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl,(nullptr_t)0x0);
  }
  return (__uniq_ptr_data<cppurses::Event,_std::default_delete<cppurses::Event>,_true,_true>)
         (tuple<cppurses::Event_*,_std::default_delete<cppurses::Event>_>)
         in_RDI.super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>._M_t.
         super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
         super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl;
}

Assistant:

auto make_mouse_event() -> std::unique_ptr<Event>
{
    auto mouse_event = ::MEVENT{};
    if (::getmouse(&mouse_event) != OK)
        return nullptr;
    Widget* receiver = detail::find_widget_at(mouse_event.x, mouse_event.y);
    if (receiver == nullptr)
        return nullptr;

    // Coordinates
    const auto global = Point{static_cast<std::size_t>(mouse_event.x),
                              static_cast<std::size_t>(mouse_event.y)};
    const auto local =
        Point{global.x - receiver->inner_x(), global.y - receiver->inner_y()};

    // Create Event
    const auto type_button = extract_info(mouse_event);
    const auto type        = type_button.first;
    const auto button      = type_button.second;
    if (type == Event::MouseButtonPress) {
        return std::make_unique<Mouse::Press>(
            *receiver, Mouse::State{button, global, local, mouse_event.id});
    }
    if (type == Event::MouseButtonRelease) {
        return std::make_unique<Mouse::Release>(
            *receiver, Mouse::State{button, global, local, mouse_event.id});
    }
    return nullptr;
}